

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment.cpp
# Opt level: O1

Alignment * __thiscall
jhu::thrax::readAlignment(Alignment *__return_storage_ptr__,thrax *this,string_view sv)

{
  Point *pPVar1;
  Point PVar2;
  Point PVar3;
  pointer pPVar4;
  char *pcVar5;
  thrax *ptVar6;
  long lVar7;
  ulong uVar8;
  invalid_argument *piVar9;
  char *pcVar10;
  pointer pPVar11;
  size_type __n;
  Point *pPVar12;
  char *__nptr;
  __normal_iterator<jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
  __i;
  pointer pPVar13;
  char *e;
  char *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar10 = (char *)sv._M_len;
  if (this == (thrax *)0x0) {
    __n = 0;
  }
  else {
    ptVar6 = (thrax *)0x0;
    __n = 0;
    do {
      __n = __n + (pcVar10[(long)ptVar6] == '-');
      ptVar6 = ptVar6 + 1;
    } while (this != ptVar6);
  }
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)local_50);
  pPVar11 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar4 = (__return_storage_ptr__->
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar11 != pPVar4) {
    __nptr = pcVar10;
    do {
      lVar7 = strtol(__nptr,&local_58,10);
      pcVar5 = local_58;
      pPVar11->src = (PointType)lVar7;
      if (local_58 == __nptr) {
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,pcVar10,this + (long)pcVar10);
        std::invalid_argument::invalid_argument(piVar9,(string *)local_50);
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      lVar7 = strtol(local_58,&local_58,10);
      pPVar11->tgt = -(short)lVar7;
      if (local_58 == pcVar5) {
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,pcVar10,this + (long)pcVar10);
        std::invalid_argument::invalid_argument(piVar9,(string *)local_50);
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      pPVar11 = pPVar11 + 1;
      __nptr = local_58;
    } while (pPVar11 != pPVar4);
  }
  pPVar11 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar4 = (__return_storage_ptr__->
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar11 != pPVar4) {
    uVar8 = (long)pPVar4 - (long)pPVar11 >> 2;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
              (pPVar11,pPVar4,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pPVar4 - (long)pPVar11 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                (pPVar11,pPVar4);
    }
    else {
      pPVar13 = pPVar11 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                (pPVar11,pPVar13);
      for (; pPVar13 != pPVar4; pPVar13 = pPVar13 + 1) {
        PVar3 = *pPVar13;
        PVar2 = pPVar13[-1];
        pPVar12 = pPVar13;
        while ((int)PVar3 * 0x10000 < (int)PVar2 * 0x10000) {
          *pPVar12 = PVar2;
          pPVar1 = pPVar12 + -2;
          pPVar12 = pPVar12 + -1;
          PVar2 = *pPVar1;
        }
        *pPVar12 = PVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Alignment readAlignment(std::string_view sv) {
  Alignment result(std::count(sv.begin(), sv.end(), '-'));
  auto s = sv.data();
  char* e;
  for (auto& p : result) {
    p.src = std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
    p.tgt = -std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
  }
  std::sort(result.begin(), result.end(), bySource);
  return result;
}